

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulesC.cpp
# Opt level: O0

char * SoapySDR_getModuleVersion(char *path)

{
  char *in_RDI;
  exception *ex;
  string *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [8];
  string *in_stack_ffffffffffffffb8;
  string local_30 [32];
  char *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_10,&local_51);
  SoapySDR::getModuleVersion(in_stack_ffffffffffffffb8);
  local_8 = toCString(in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return local_8;
}

Assistant:

char *SoapySDR_getModuleVersion(const char *path)
{
    __SOAPY_SDR_C_TRY
    return toCString(SoapySDR::getModuleVersion(path));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}